

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  Expr *p;
  int iVar1;
  CollSeq *pCVar2;
  Expr *pValue;
  Expr *pEVar3;
  
  while( true ) {
    if (pExpr == (Expr *)0x0) {
      return;
    }
    if ((pExpr->flags & 1) != 0) break;
    if (pExpr->op != ',') {
      if (pExpr->op == '5') {
        p = pExpr->pLeft;
        pEVar3 = pExpr->pRight;
        if (((((pEVar3->op == 0xa2) && ((pEVar3->flags & 8) == 0)) &&
             (iVar1 = sqlite3ExprIsConstant(p), iVar1 != 0)) &&
            ((pCVar2 = sqlite3BinaryCompareCollSeq(pConst->pParse,p,pEVar3), pValue = p,
             pCVar2 == (CollSeq *)0x0 || (pCVar2->xCmp == binCollFunc)))) ||
           (((p->op == 0xa2 &&
             (((p->flags & 8) == 0 && (iVar1 = sqlite3ExprIsConstant(pEVar3), iVar1 != 0)))) &&
            ((pCVar2 = sqlite3BinaryCompareCollSeq(pConst->pParse,p,pEVar3), pValue = pEVar3,
             pEVar3 = p, pCVar2 == (CollSeq *)0x0 || (pCVar2->xCmp == binCollFunc)))))) {
          constInsert(pConst,pEVar3,pValue);
          return;
        }
      }
      return;
    }
    findConstInWhere(pConst,pExpr->pRight);
    pExpr = pExpr->pLeft;
  }
  return;
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( pExpr==0 ) return;
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return;
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN
   && !ExprHasProperty(pRight, EP_FixedCol)
   && sqlite3ExprIsConstant(pLeft)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pRight, pLeft);
  }else
  if( pLeft->op==TK_COLUMN
   && !ExprHasProperty(pLeft, EP_FixedCol)
   && sqlite3ExprIsConstant(pRight)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pLeft, pRight);
  }
}